

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::SubroutineFunctionSet::push_back
          (SubroutineFunctionSet *this,SubroutineFunction *_fn)

{
  SubroutineFunction *_fn_local;
  SubroutineFunctionSet *this_local;
  
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::push_back(&this->fn,_fn);
  return;
}

Assistant:

void push_back(const SubroutineFunction& _fn)
	{
		fn.push_back(_fn);
	}